

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::AddSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,TPZFMatrix<Fad<double>_> *A)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZBaseMatrix *in_RCX;
  Fad<double> *in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t c;
  int64_t col;
  int64_t r;
  int64_t row;
  int64_t minCol;
  int64_t minRow;
  Fad<double> *this_00;
  int64_t local_f8;
  int64_t local_e8;
  Fad<double> *in_stack_ffffffffffffff30;
  Fad<double> *in_stack_ffffffffffffff38;
  undefined1 local_c0 [8];
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffff48;
  Fad<double> *in_stack_ffffffffffffff50;
  undefined1 local_a0 [48];
  undefined1 local_70 [32];
  long local_50;
  Fad<double> *local_48;
  long local_40;
  long local_38;
  int64_t local_30;
  int64_t local_28;
  TPZBaseMatrix *local_20;
  Fad<double> *local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RCX);
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar2 < iVar3 - local_10) {
    local_e8 = TPZBaseMatrix::Rows(local_20);
  }
  else {
    local_e8 = TPZBaseMatrix::Rows(in_RDI);
    local_e8 = local_e8 - local_10;
  }
  local_28 = local_e8;
  iVar2 = TPZBaseMatrix::Cols(local_20);
  iVar3 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar2 < iVar3 - (long)local_18) {
    local_f8 = TPZBaseMatrix::Cols(local_20);
  }
  else {
    local_f8 = TPZBaseMatrix::Cols(in_RDI);
    local_f8 = local_f8 - (long)local_18;
  }
  local_30 = local_f8;
  local_38 = local_10;
  for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
    local_48 = local_18;
    for (local_50 = 0; lVar1 = local_38, local_50 < local_30; local_50 = local_50 + 1) {
      this_00 = local_48;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_a0);
      (*(local_20->super_TPZSavable)._vptr_TPZSavable[0x24])(local_c0,local_20,local_40,local_50);
      operator+<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,this_00,local_70);
      Fad<double>::~Fad(this_00);
      FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)this_00);
      Fad<double>::~Fad(this_00);
      Fad<double>::~Fad(this_00);
      local_48 = (Fad<double> *)((long)&local_48->val_ + 1);
    }
    local_38 = local_38 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow,const int64_t sCol,const TPZFMatrix<TVar> &A ) {
	
    int64_t minRow = MIN( A.Rows(), Rows() - sRow );
    int64_t minCol = MIN( A.Cols(), Cols() - sCol );
	//  REAL v;
	
	int64_t row = sRow;
    for ( int64_t r = 0; r < minRow; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < minCol; c++, col++ ) {
            PutVal( row, col, GetVal( row, col ) + A.GetVal( r, c ) );
        }
    }
    return( 1 );
}